

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::avx::BVHNIntersector1<4,_16781328,_false,_embree::avx::VirtualCurveIntersector1>::
     occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar6;
  long lVar7;
  float fVar8;
  float fVar9;
  char cVar10;
  AABBNodeMB4D *node1;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong *puVar16;
  ulong uVar17;
  ulong uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [64];
  float fVar25;
  float fVar29;
  float fVar30;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  float fVar31;
  vint4 bi;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  vint4 bi_3;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  float fVar43;
  vfloat4 a0;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  vint4 ai_1;
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  float fVar58;
  vint4 ai_3;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  vint4 ai;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  float fVar71;
  float fVar74;
  float fVar75;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  float fVar76;
  float fVar77;
  float fVar80;
  float fVar81;
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  float fVar82;
  undefined1 auVar83 [16];
  float fVar84;
  float fVar87;
  float fVar88;
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  float fVar89;
  undefined1 auVar90 [16];
  Precalculations pre;
  NodeRef stack [244];
  float local_828;
  float fStack_824;
  float fStack_820;
  float fStack_81c;
  float local_818 [4];
  undefined1 local_808 [16];
  undefined1 local_7f8 [16];
  undefined1 local_7e8 [16];
  ulong local_7d8;
  ulong local_7d0 [244];
  
  local_7d8 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_7d8 != 8) {
    fVar3 = ray->tfar;
    if (0.0 <= fVar3) {
      aVar6 = (ray->dir).field_0.field_1;
      auVar26 = vdpps_avx((undefined1  [16])aVar6,(undefined1  [16])aVar6,0x7f);
      auVar27 = vrsqrtss_avx(auVar26,auVar26);
      fVar43 = auVar27._0_4_;
      local_818[0] = fVar43 * 1.5 - auVar26._0_4_ * 0.5 * fVar43 * fVar43 * fVar43;
      fVar43 = (ray->dir).field_0.m128[0];
      fVar4 = (ray->dir).field_0.m128[1];
      fVar5 = (ray->dir).field_0.m128[2];
      auVar20 = vshufps_avx(ZEXT416((uint)local_818[0]),ZEXT416((uint)local_818[0]),0);
      auVar44._0_4_ = aVar6.x * auVar20._0_4_;
      auVar44._4_4_ = aVar6.y * auVar20._4_4_;
      auVar44._8_4_ = aVar6.z * auVar20._8_4_;
      auVar44._12_4_ = aVar6.field_3.w * auVar20._12_4_;
      auVar27 = vshufpd_avx(auVar44,auVar44,1);
      auVar26 = vmovshdup_avx(auVar44);
      auVar67._8_4_ = 0x80000000;
      auVar67._0_8_ = 0x8000000080000000;
      auVar67._12_4_ = 0x80000000;
      auVar51._12_4_ = 0;
      auVar51._0_12_ = ZEXT812(0);
      auVar51 = auVar51 << 0x20;
      auVar32 = vunpckhps_avx(auVar44,auVar51);
      auVar38 = vshufps_avx(auVar32,ZEXT416(auVar26._0_4_ ^ 0x80000000),0x41);
      auVar63._0_8_ = auVar27._0_8_ ^ 0x8000000080000000;
      auVar63._8_8_ = auVar27._8_8_ ^ auVar67._8_8_;
      auVar32 = vinsertps_avx(auVar63,auVar44,0x2a);
      auVar26 = vdpps_avx(auVar38,auVar38,0x7f);
      auVar27 = vdpps_avx(auVar32,auVar32,0x7f);
      auVar26 = vcmpps_avx(auVar27,auVar26,1);
      auVar26 = vshufps_avx(auVar26,auVar26,0);
      auVar26 = vblendvps_avx(auVar32,auVar38,auVar26);
      auVar27 = vdpps_avx(auVar26,auVar26,0x7f);
      auVar32 = vrsqrtss_avx(auVar27,auVar27);
      fVar58 = auVar32._0_4_;
      auVar27 = ZEXT416((uint)(fVar58 * 1.5 - auVar27._0_4_ * 0.5 * fVar58 * fVar58 * fVar58));
      auVar27 = vshufps_avx(auVar27,auVar27,0);
      auVar64._0_4_ = auVar26._0_4_ * auVar27._0_4_;
      auVar64._4_4_ = auVar26._4_4_ * auVar27._4_4_;
      auVar64._8_4_ = auVar26._8_4_ * auVar27._8_4_;
      auVar64._12_4_ = auVar26._12_4_ * auVar27._12_4_;
      auVar26 = vshufps_avx(auVar64,auVar64,0xc9);
      auVar27 = vshufps_avx(auVar44,auVar44,0xc9);
      auVar70._0_4_ = auVar27._0_4_ * auVar64._0_4_;
      auVar70._4_4_ = auVar27._4_4_ * auVar64._4_4_;
      auVar70._8_4_ = auVar27._8_4_ * auVar64._8_4_;
      auVar70._12_4_ = auVar27._12_4_ * auVar64._12_4_;
      auVar68._0_4_ = auVar26._0_4_ * auVar44._0_4_;
      auVar68._4_4_ = auVar26._4_4_ * auVar44._4_4_;
      auVar68._8_4_ = auVar26._8_4_ * auVar44._8_4_;
      auVar68._12_4_ = auVar26._12_4_ * auVar44._12_4_;
      auVar26 = vsubps_avx(auVar68,auVar70);
      auVar32 = vshufps_avx(auVar26,auVar26,0xc9);
      auVar26 = vdpps_avx(auVar32,auVar32,0x7f);
      auVar27 = vrsqrtss_avx(auVar26,auVar26);
      fVar58 = auVar27._0_4_;
      auVar26 = ZEXT416((uint)(fVar58 * 1.5 - auVar26._0_4_ * 0.5 * fVar58 * fVar58 * fVar58));
      auVar26 = vshufps_avx(auVar26,auVar26,0);
      auVar27._0_4_ = auVar32._0_4_ * auVar26._0_4_;
      auVar27._4_4_ = auVar32._4_4_ * auVar26._4_4_;
      auVar27._8_4_ = auVar32._8_4_ * auVar26._8_4_;
      auVar27._12_4_ = auVar32._12_4_ * auVar26._12_4_;
      auVar26._0_4_ = auVar20._0_4_ * auVar44._0_4_;
      auVar26._4_4_ = auVar20._4_4_ * auVar44._4_4_;
      auVar26._8_4_ = auVar20._8_4_ * auVar44._8_4_;
      auVar26._12_4_ = auVar20._12_4_ * auVar44._12_4_;
      auVar32 = vunpcklps_avx(auVar64,auVar26);
      auVar26 = vunpckhps_avx(auVar64,auVar26);
      auVar20 = vunpcklps_avx(auVar27,auVar51);
      auVar27 = vunpckhps_avx(auVar27,auVar51);
      local_7e8 = vunpcklps_avx(auVar26,auVar27);
      local_808 = vunpcklps_avx(auVar32,auVar20);
      local_7f8 = vunpckhps_avx(auVar32,auVar20);
      puVar16 = local_7d0;
      auVar27 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar32._8_4_ = 0x7fffffff;
      auVar32._0_8_ = 0x7fffffff7fffffff;
      auVar32._12_4_ = 0x7fffffff;
      auVar26 = vandps_avx((undefined1  [16])aVar6,auVar32);
      auVar38._8_4_ = 0x219392ef;
      auVar38._0_8_ = 0x219392ef219392ef;
      auVar38._12_4_ = 0x219392ef;
      auVar26 = vcmpps_avx(auVar26,auVar38,1);
      auVar26 = vblendvps_avx((undefined1  [16])aVar6,auVar38,auVar26);
      auVar32 = vrcpps_avx(auVar26);
      fVar58 = auVar32._0_4_;
      auVar20._0_4_ = auVar26._0_4_ * fVar58;
      fVar8 = auVar32._4_4_;
      auVar20._4_4_ = auVar26._4_4_ * fVar8;
      fVar9 = auVar32._8_4_;
      auVar20._8_4_ = auVar26._8_4_ * fVar9;
      fVar71 = auVar32._12_4_;
      auVar20._12_4_ = auVar26._12_4_ * fVar71;
      auVar35._8_4_ = 0x3f800000;
      auVar35._0_8_ = 0x3f8000003f800000;
      auVar35._12_4_ = 0x3f800000;
      auVar26 = vsubps_avx(auVar35,auVar20);
      auVar21._0_4_ = fVar58 + fVar58 * auVar26._0_4_;
      auVar21._4_4_ = fVar8 + fVar8 * auVar26._4_4_;
      auVar21._8_4_ = fVar9 + fVar9 * auVar26._8_4_;
      auVar21._12_4_ = fVar71 + fVar71 * auVar26._12_4_;
      fVar58 = (ray->org).field_0.m128[0];
      auVar83._4_4_ = fVar58;
      auVar83._0_4_ = fVar58;
      auVar83._8_4_ = fVar58;
      auVar83._12_4_ = fVar58;
      fVar8 = (ray->org).field_0.m128[1];
      auVar90._4_4_ = fVar8;
      auVar90._0_4_ = fVar8;
      auVar90._8_4_ = fVar8;
      auVar90._12_4_ = fVar8;
      fVar9 = (ray->org).field_0.m128[2];
      auVar20 = vshufps_avx(auVar21,auVar21,0);
      auVar26 = vmovshdup_avx(auVar21);
      auVar38 = vshufps_avx(auVar21,auVar21,0x55);
      uVar18 = (ulong)(auVar21._0_4_ < 0.0) * 0x10;
      auVar32 = vshufpd_avx(auVar21,auVar21,1);
      auVar51 = vshufps_avx(auVar21,auVar21,0xaa);
      uVar15 = (ulong)(auVar26._0_4_ < 0.0) << 4 | 0x20;
      uVar17 = (ulong)(auVar32._0_4_ < 0.0) << 4 | 0x40;
      auVar26 = vshufps_avx(auVar27,auVar27,0);
      auVar27 = vshufps_avx(ZEXT416((uint)fVar3),ZEXT416((uint)fVar3),0);
LAB_00b61087:
      if (puVar16 != &local_7d8) {
        uVar12 = puVar16[-1];
        puVar16 = puVar16 + -1;
        auVar24 = ZEXT1664(CONCAT412(fVar9,CONCAT48(fVar9,CONCAT44(fVar9,fVar9))));
        do {
          fVar3 = (ray->dir).field_0.m128[3];
          auVar19._4_4_ = fVar3;
          auVar19._0_4_ = fVar3;
          auVar19._8_4_ = fVar3;
          auVar19._12_4_ = fVar3;
          fVar71 = 1.0 - fVar3;
          auVar32 = vshufps_avx(ZEXT416((uint)fVar71),ZEXT416((uint)fVar71),0);
          auVar21 = vshufps_avx(ZEXT416((uint)(fVar71 * 0.0)),ZEXT416((uint)(fVar71 * 0.0)),0);
          do {
            if ((uVar12 & 8) != 0) {
              cVar10 = (**(code **)((long)This->leafIntersector +
                                   (ulong)*(byte *)(uVar12 & 0xfffffffffffffff0) * 0x40 + 8))
                                 (local_818,ray,context);
              if (cVar10 != '\0') {
                ray->tfar = -INFINITY;
                return;
              }
              goto LAB_00b61087;
            }
            uVar13 = (uint)uVar12 & 7;
            uVar11 = uVar12 & 0xfffffffffffffff0;
            if (uVar13 == 3) {
              auVar72._0_4_ =
                   fVar43 * *(float *)(uVar11 + 0x20) +
                   *(float *)(uVar11 + 0x50) * fVar4 + *(float *)(uVar11 + 0x80) * fVar5;
              auVar72._4_4_ =
                   fVar43 * *(float *)(uVar11 + 0x24) +
                   *(float *)(uVar11 + 0x54) * fVar4 + *(float *)(uVar11 + 0x84) * fVar5;
              auVar72._8_4_ =
                   fVar43 * *(float *)(uVar11 + 0x28) +
                   *(float *)(uVar11 + 0x58) * fVar4 + *(float *)(uVar11 + 0x88) * fVar5;
              auVar72._12_4_ =
                   fVar43 * *(float *)(uVar11 + 0x2c) +
                   *(float *)(uVar11 + 0x5c) * fVar4 + *(float *)(uVar11 + 0x8c) * fVar5;
              auVar78._0_4_ =
                   fVar43 * *(float *)(uVar11 + 0x30) +
                   fVar4 * *(float *)(uVar11 + 0x60) + *(float *)(uVar11 + 0x90) * fVar5;
              auVar78._4_4_ =
                   fVar43 * *(float *)(uVar11 + 0x34) +
                   fVar4 * *(float *)(uVar11 + 100) + *(float *)(uVar11 + 0x94) * fVar5;
              auVar78._8_4_ =
                   fVar43 * *(float *)(uVar11 + 0x38) +
                   fVar4 * *(float *)(uVar11 + 0x68) + *(float *)(uVar11 + 0x98) * fVar5;
              auVar78._12_4_ =
                   fVar43 * *(float *)(uVar11 + 0x3c) +
                   fVar4 * *(float *)(uVar11 + 0x6c) + *(float *)(uVar11 + 0x9c) * fVar5;
              auVar85._0_4_ =
                   fVar43 * *(float *)(uVar11 + 0x40) +
                   fVar4 * *(float *)(uVar11 + 0x70) + *(float *)(uVar11 + 0xa0) * fVar5;
              auVar85._4_4_ =
                   fVar43 * *(float *)(uVar11 + 0x44) +
                   fVar4 * *(float *)(uVar11 + 0x74) + *(float *)(uVar11 + 0xa4) * fVar5;
              auVar85._8_4_ =
                   fVar43 * *(float *)(uVar11 + 0x48) +
                   fVar4 * *(float *)(uVar11 + 0x78) + *(float *)(uVar11 + 0xa8) * fVar5;
              auVar85._12_4_ =
                   fVar43 * *(float *)(uVar11 + 0x4c) +
                   fVar4 * *(float *)(uVar11 + 0x7c) + *(float *)(uVar11 + 0xac) * fVar5;
              auVar22._8_4_ = 0x7fffffff;
              auVar22._0_8_ = 0x7fffffff7fffffff;
              auVar22._12_4_ = 0x7fffffff;
              auVar35 = vandps_avx(auVar72,auVar22);
              auVar28._8_4_ = 0x219392ef;
              auVar28._0_8_ = 0x219392ef219392ef;
              auVar28._12_4_ = 0x219392ef;
              auVar35 = vcmpps_avx(auVar35,auVar28,1);
              auVar44 = vblendvps_avx(auVar72,auVar28,auVar35);
              auVar35 = vandps_avx(auVar78,auVar22);
              auVar35 = vcmpps_avx(auVar35,auVar28,1);
              auVar63 = vblendvps_avx(auVar78,auVar28,auVar35);
              auVar35 = vandps_avx(auVar85,auVar22);
              auVar35 = vcmpps_avx(auVar35,auVar28,1);
              auVar35 = vblendvps_avx(auVar85,auVar28,auVar35);
              auVar64 = vrcpps_avx(auVar44);
              fVar71 = auVar64._0_4_;
              auVar73._0_4_ = auVar44._0_4_ * fVar71;
              fVar74 = auVar64._4_4_;
              auVar73._4_4_ = auVar44._4_4_ * fVar74;
              fVar75 = auVar64._8_4_;
              auVar73._8_4_ = auVar44._8_4_ * fVar75;
              fVar76 = auVar64._12_4_;
              auVar73._12_4_ = auVar44._12_4_ * fVar76;
              auVar23._8_4_ = 0x3f800000;
              auVar23._0_8_ = 0x3f8000003f800000;
              auVar23._12_4_ = 0x3f800000;
              auVar44 = vsubps_avx(auVar23,auVar73);
              fVar71 = fVar71 + fVar71 * auVar44._0_4_;
              fVar74 = fVar74 + fVar74 * auVar44._4_4_;
              fVar75 = fVar75 + fVar75 * auVar44._8_4_;
              fVar76 = fVar76 + fVar76 * auVar44._12_4_;
              auVar44 = vrcpps_avx(auVar63);
              fVar77 = auVar44._0_4_;
              auVar79._0_4_ = auVar63._0_4_ * fVar77;
              fVar80 = auVar44._4_4_;
              auVar79._4_4_ = auVar63._4_4_ * fVar80;
              fVar81 = auVar44._8_4_;
              auVar79._8_4_ = auVar63._8_4_ * fVar81;
              fVar82 = auVar44._12_4_;
              auVar79._12_4_ = auVar63._12_4_ * fVar82;
              auVar44 = vsubps_avx(auVar23,auVar79);
              fVar77 = fVar77 + fVar77 * auVar44._0_4_;
              fVar80 = fVar80 + fVar80 * auVar44._4_4_;
              fVar81 = fVar81 + fVar81 * auVar44._8_4_;
              fVar82 = fVar82 + fVar82 * auVar44._12_4_;
              auVar44 = vrcpps_avx(auVar35);
              fVar84 = auVar44._0_4_;
              auVar86._0_4_ = auVar35._0_4_ * fVar84;
              fVar87 = auVar44._4_4_;
              auVar86._4_4_ = auVar35._4_4_ * fVar87;
              fVar88 = auVar44._8_4_;
              auVar86._8_4_ = auVar35._8_4_ * fVar88;
              fVar89 = auVar44._12_4_;
              auVar86._12_4_ = auVar35._12_4_ * fVar89;
              auVar35 = vsubps_avx(auVar23,auVar86);
              auVar24 = ZEXT1664(CONCAT412(fVar9,CONCAT48(fVar9,CONCAT44(fVar9,fVar9))));
              fVar84 = fVar84 + fVar84 * auVar35._0_4_;
              fVar87 = fVar87 + fVar87 * auVar35._4_4_;
              fVar88 = fVar88 + fVar88 * auVar35._8_4_;
              fVar89 = fVar89 + fVar89 * auVar35._12_4_;
              auVar49._0_4_ =
                   fVar8 * *(float *)(uVar11 + 0x50) +
                   *(float *)(uVar11 + 0x80) * fVar9 + *(float *)(uVar11 + 0xb0) +
                   fVar58 * *(float *)(uVar11 + 0x20);
              auVar49._4_4_ =
                   fVar8 * *(float *)(uVar11 + 0x54) +
                   *(float *)(uVar11 + 0x84) * fVar9 + *(float *)(uVar11 + 0xb4) +
                   fVar58 * *(float *)(uVar11 + 0x24);
              auVar49._8_4_ =
                   fVar8 * *(float *)(uVar11 + 0x58) +
                   *(float *)(uVar11 + 0x88) * fVar9 + *(float *)(uVar11 + 0xb8) +
                   fVar58 * *(float *)(uVar11 + 0x28);
              auVar49._12_4_ =
                   fVar8 * *(float *)(uVar11 + 0x5c) +
                   *(float *)(uVar11 + 0x8c) * fVar9 + *(float *)(uVar11 + 0xbc) +
                   fVar58 * *(float *)(uVar11 + 0x2c);
              auVar41._0_4_ =
                   fVar58 * *(float *)(uVar11 + 0x30) +
                   *(float *)(uVar11 + 0x90) * fVar9 + *(float *)(uVar11 + 0xc0) +
                   fVar8 * *(float *)(uVar11 + 0x60);
              auVar41._4_4_ =
                   fVar58 * *(float *)(uVar11 + 0x34) +
                   *(float *)(uVar11 + 0x94) * fVar9 + *(float *)(uVar11 + 0xc4) +
                   fVar8 * *(float *)(uVar11 + 100);
              auVar41._8_4_ =
                   fVar58 * *(float *)(uVar11 + 0x38) +
                   *(float *)(uVar11 + 0x98) * fVar9 + *(float *)(uVar11 + 200) +
                   fVar8 * *(float *)(uVar11 + 0x68);
              auVar41._12_4_ =
                   fVar58 * *(float *)(uVar11 + 0x3c) +
                   *(float *)(uVar11 + 0x9c) * fVar9 + *(float *)(uVar11 + 0xcc) +
                   fVar8 * *(float *)(uVar11 + 0x6c);
              local_828 = auVar21._0_4_;
              fStack_824 = auVar21._4_4_;
              fStack_820 = auVar21._8_4_;
              fStack_81c = auVar21._12_4_;
              auVar61._0_4_ = local_828 + fVar3 * *(float *)(uVar11 + 0xe0);
              auVar61._4_4_ = fStack_824 + fVar3 * *(float *)(uVar11 + 0xe4);
              auVar61._8_4_ = fStack_820 + fVar3 * *(float *)(uVar11 + 0xe8);
              auVar61._12_4_ = fStack_81c + fVar3 * *(float *)(uVar11 + 0xec);
              auVar65._0_4_ = local_828 + fVar3 * *(float *)(uVar11 + 0xf0);
              auVar65._4_4_ = fStack_824 + fVar3 * *(float *)(uVar11 + 0xf4);
              auVar65._8_4_ = fStack_820 + fVar3 * *(float *)(uVar11 + 0xf8);
              auVar65._12_4_ = fStack_81c + fVar3 * *(float *)(uVar11 + 0xfc);
              auVar36._0_4_ =
                   fVar58 * *(float *)(uVar11 + 0x40) +
                   *(float *)(uVar11 + 0xa0) * fVar9 + *(float *)(uVar11 + 0xd0) +
                   fVar8 * *(float *)(uVar11 + 0x70);
              auVar36._4_4_ =
                   fVar58 * *(float *)(uVar11 + 0x44) +
                   *(float *)(uVar11 + 0xa4) * fVar9 + *(float *)(uVar11 + 0xd4) +
                   fVar8 * *(float *)(uVar11 + 0x74);
              auVar36._8_4_ =
                   fVar58 * *(float *)(uVar11 + 0x48) +
                   *(float *)(uVar11 + 0xa8) * fVar9 + *(float *)(uVar11 + 0xd8) +
                   fVar8 * *(float *)(uVar11 + 0x78);
              auVar36._12_4_ =
                   fVar58 * *(float *)(uVar11 + 0x4c) +
                   *(float *)(uVar11 + 0xac) * fVar9 + *(float *)(uVar11 + 0xdc) +
                   fVar8 * *(float *)(uVar11 + 0x7c);
              fVar25 = auVar32._0_4_;
              auVar54._0_4_ = fVar25 + fVar3 * *(float *)(uVar11 + 0x110);
              fVar29 = auVar32._4_4_;
              auVar54._4_4_ = fVar29 + fVar3 * *(float *)(uVar11 + 0x114);
              fVar30 = auVar32._8_4_;
              auVar54._8_4_ = fVar30 + fVar3 * *(float *)(uVar11 + 0x118);
              fVar31 = auVar32._12_4_;
              auVar54._12_4_ = fVar31 + fVar3 * *(float *)(uVar11 + 0x11c);
              auVar35 = vsubps_avx(auVar61,auVar49);
              auVar44 = vsubps_avx(auVar54,auVar49);
              auVar69._0_4_ = local_828 + fVar3 * *(float *)(uVar11 + 0x100);
              auVar69._4_4_ = fStack_824 + fVar3 * *(float *)(uVar11 + 0x104);
              auVar69._8_4_ = fStack_820 + fVar3 * *(float *)(uVar11 + 0x108);
              auVar69._12_4_ = fStack_81c + fVar3 * *(float *)(uVar11 + 0x10c);
              auVar55._0_4_ = fVar25 + fVar3 * *(float *)(uVar11 + 0x120);
              auVar55._4_4_ = fVar29 + fVar3 * *(float *)(uVar11 + 0x124);
              auVar55._8_4_ = fVar30 + fVar3 * *(float *)(uVar11 + 0x128);
              auVar55._12_4_ = fVar31 + fVar3 * *(float *)(uVar11 + 300);
              auVar63 = vsubps_avx(auVar65,auVar41);
              auVar64 = vsubps_avx(auVar55,auVar41);
              auVar56._0_4_ = fVar25 + fVar3 * *(float *)(uVar11 + 0x130);
              auVar56._4_4_ = fVar29 + fVar3 * *(float *)(uVar11 + 0x134);
              auVar56._8_4_ = fVar30 + fVar3 * *(float *)(uVar11 + 0x138);
              auVar56._12_4_ = fVar31 + fVar3 * *(float *)(uVar11 + 0x13c);
              auVar67 = vsubps_avx(auVar69,auVar36);
              auVar68 = vsubps_avx(auVar56,auVar36);
              auVar57._0_4_ = fVar71 * auVar35._0_4_;
              auVar57._4_4_ = fVar74 * auVar35._4_4_;
              auVar57._8_4_ = fVar75 * auVar35._8_4_;
              auVar57._12_4_ = fVar76 * auVar35._12_4_;
              auVar50._0_4_ = fVar71 * auVar44._0_4_;
              auVar50._4_4_ = fVar74 * auVar44._4_4_;
              auVar50._8_4_ = fVar75 * auVar44._8_4_;
              auVar50._12_4_ = fVar76 * auVar44._12_4_;
              auVar62._0_4_ = auVar63._0_4_ * fVar77;
              auVar62._4_4_ = auVar63._4_4_ * fVar80;
              auVar62._8_4_ = auVar63._8_4_ * fVar81;
              auVar62._12_4_ = auVar63._12_4_ * fVar82;
              auVar66._0_4_ = auVar67._0_4_ * fVar84;
              auVar66._4_4_ = auVar67._4_4_ * fVar87;
              auVar66._8_4_ = auVar67._8_4_ * fVar88;
              auVar66._12_4_ = auVar67._12_4_ * fVar89;
              auVar42._0_4_ = fVar77 * auVar64._0_4_;
              auVar42._4_4_ = fVar80 * auVar64._4_4_;
              auVar42._8_4_ = fVar81 * auVar64._8_4_;
              auVar42._12_4_ = fVar82 * auVar64._12_4_;
              auVar37._0_4_ = fVar84 * auVar68._0_4_;
              auVar37._4_4_ = fVar87 * auVar68._4_4_;
              auVar37._8_4_ = fVar88 * auVar68._8_4_;
              auVar37._12_4_ = fVar89 * auVar68._12_4_;
              auVar35 = vpminsd_avx(auVar62,auVar42);
              auVar44 = vpminsd_avx(auVar66,auVar37);
              auVar35 = vmaxps_avx(auVar35,auVar44);
              auVar67 = vpminsd_avx(auVar57,auVar50);
              auVar64 = vpmaxsd_avx(auVar57,auVar50);
              auVar44 = vpmaxsd_avx(auVar62,auVar42);
              auVar63 = vpmaxsd_avx(auVar66,auVar37);
              auVar63 = vminps_avx(auVar44,auVar63);
              auVar44 = vmaxps_avx(auVar26,auVar67);
              auVar35 = vmaxps_avx(auVar44,auVar35);
              auVar44 = vminps_avx(auVar27,auVar64);
              auVar44 = vminps_avx(auVar44,auVar63);
              auVar35 = vcmpps_avx(auVar35,auVar44,2);
            }
            else {
              pfVar2 = (float *)(uVar11 + 0x80 + uVar18);
              pfVar1 = (float *)(uVar11 + 0x20 + uVar18);
              auVar33._0_4_ = fVar3 * *pfVar2 + *pfVar1;
              auVar33._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
              auVar33._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
              auVar33._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
              auVar35 = vsubps_avx(auVar33,auVar83);
              pfVar2 = (float *)(uVar11 + 0x80 + uVar15);
              auVar34._0_4_ = auVar20._0_4_ * auVar35._0_4_;
              auVar34._4_4_ = auVar20._4_4_ * auVar35._4_4_;
              auVar34._8_4_ = auVar20._8_4_ * auVar35._8_4_;
              auVar34._12_4_ = auVar20._12_4_ * auVar35._12_4_;
              pfVar1 = (float *)(uVar11 + 0x20 + uVar15);
              auVar39._0_4_ = fVar3 * *pfVar2 + *pfVar1;
              auVar39._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
              auVar39._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
              auVar39._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
              auVar35 = vsubps_avx(auVar39,auVar90);
              pfVar2 = (float *)(uVar11 + 0x80 + uVar17);
              pfVar1 = (float *)(uVar11 + 0x20 + uVar17);
              auVar45._0_4_ = fVar3 * *pfVar2 + *pfVar1;
              auVar45._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
              auVar45._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
              auVar45._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
              auVar40._0_4_ = auVar38._0_4_ * auVar35._0_4_;
              auVar40._4_4_ = auVar38._4_4_ * auVar35._4_4_;
              auVar40._8_4_ = auVar38._8_4_ * auVar35._8_4_;
              auVar40._12_4_ = auVar38._12_4_ * auVar35._12_4_;
              auVar35 = vsubps_avx(auVar45,auVar24._0_16_);
              auVar46._0_4_ = auVar51._0_4_ * auVar35._0_4_;
              auVar46._4_4_ = auVar51._4_4_ * auVar35._4_4_;
              auVar46._8_4_ = auVar51._8_4_ * auVar35._8_4_;
              auVar46._12_4_ = auVar51._12_4_ * auVar35._12_4_;
              auVar35 = vmaxps_avx(auVar40,auVar46);
              pfVar2 = (float *)(uVar11 + 0x80 + (uVar18 ^ 0x10));
              pfVar1 = (float *)(uVar11 + 0x20 + (uVar18 ^ 0x10));
              auVar47._0_4_ = fVar3 * *pfVar2 + *pfVar1;
              auVar47._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
              auVar47._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
              auVar47._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
              auVar44 = vsubps_avx(auVar47,auVar83);
              auVar48._0_4_ = auVar20._0_4_ * auVar44._0_4_;
              auVar48._4_4_ = auVar20._4_4_ * auVar44._4_4_;
              auVar48._8_4_ = auVar20._8_4_ * auVar44._8_4_;
              auVar48._12_4_ = auVar20._12_4_ * auVar44._12_4_;
              pfVar2 = (float *)(uVar11 + 0x80 + (uVar15 ^ 0x10));
              pfVar1 = (float *)(uVar11 + 0x20 + (uVar15 ^ 0x10));
              auVar52._0_4_ = fVar3 * *pfVar2 + *pfVar1;
              auVar52._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
              auVar52._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
              auVar52._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
              auVar44 = vsubps_avx(auVar52,auVar90);
              auVar53._0_4_ = auVar38._0_4_ * auVar44._0_4_;
              auVar53._4_4_ = auVar38._4_4_ * auVar44._4_4_;
              auVar53._8_4_ = auVar38._8_4_ * auVar44._8_4_;
              auVar53._12_4_ = auVar38._12_4_ * auVar44._12_4_;
              pfVar2 = (float *)(uVar11 + 0x80 + (uVar17 ^ 0x10));
              pfVar1 = (float *)(uVar11 + 0x20 + (uVar17 ^ 0x10));
              auVar59._0_4_ = fVar3 * *pfVar2 + *pfVar1;
              auVar59._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
              auVar59._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
              auVar59._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
              auVar44 = vsubps_avx(auVar59,auVar24._0_16_);
              auVar60._0_4_ = auVar51._0_4_ * auVar44._0_4_;
              auVar60._4_4_ = auVar51._4_4_ * auVar44._4_4_;
              auVar60._8_4_ = auVar51._8_4_ * auVar44._8_4_;
              auVar60._12_4_ = auVar51._12_4_ * auVar44._12_4_;
              auVar63 = vminps_avx(auVar53,auVar60);
              auVar44 = vmaxps_avx(auVar26,auVar34);
              auVar35 = vmaxps_avx(auVar44,auVar35);
              auVar44 = vminps_avx(auVar27,auVar48);
              auVar44 = vminps_avx(auVar44,auVar63);
              auVar35 = vcmpps_avx(auVar35,auVar44,2);
              if (uVar13 == 6) {
                auVar44 = vcmpps_avx(*(undefined1 (*) [16])(uVar11 + 0xe0),auVar19,2);
                auVar63 = vcmpps_avx(auVar19,*(undefined1 (*) [16])(uVar11 + 0xf0),1);
                auVar44 = vandps_avx(auVar44,auVar63);
                auVar35 = vandps_avx(auVar44,auVar35);
              }
            }
            auVar35 = vpslld_avx(auVar35,0x1f);
            uVar13 = vmovmskps_avx(auVar35);
            if (uVar13 == 0) goto LAB_00b61087;
            uVar13 = uVar13 & 0xff;
            lVar7 = 0;
            if (uVar13 != 0) {
              for (; (uVar13 >> lVar7 & 1) == 0; lVar7 = lVar7 + 1) {
              }
            }
            uVar12 = *(ulong *)(uVar11 + lVar7 * 8);
            uVar13 = uVar13 - 1 & uVar13;
            uVar14 = (ulong)uVar13;
          } while (uVar13 == 0);
          do {
            *puVar16 = uVar12;
            puVar16 = puVar16 + 1;
            lVar7 = 0;
            if (uVar14 != 0) {
              for (; (uVar14 >> lVar7 & 1) == 0; lVar7 = lVar7 + 1) {
              }
            }
            uVar12 = *(ulong *)(uVar11 + lVar7 * 8);
            uVar14 = uVar14 - 1 & uVar14;
          } while (uVar14 != 0);
        } while( true );
      }
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }